

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

int __thiscall AGSMock::MockEngine::IncrementManagedObjectRefCount(MockEngine *this,char *address)

{
  int iVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  char *local_18;
  
  local_18 = address;
  sVar2 = std::
          _Hashtable<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::count(&(this->data_->objects)._M_h,&local_18);
  if (sVar2 == 0) {
    iVar1 = 0;
  }
  else {
    local_18 = address;
    pmVar3 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->data_->objects,&local_18);
    iVar1 = pmVar3->count + 1;
    pmVar3->count = iVar1;
  }
  return iVar1;
}

Assistant:

int MockEngine::IncrementManagedObjectRefCount(const char *address)
{
	if (data_->objects.count((void *) address) < 1)
		return 0;

	return ++data_->objects[(void *) address].count;
}